

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

void __thiscall QPushButtonPrivate::resetLayoutItemMargins(QPushButtonPrivate *this)

{
  long lVar1;
  long *plVar2;
  long in_FS_OFFSET;
  QStyleOptionButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton(&opt);
  (**(code **)(*plVar2 + 0x1b8))(plVar2,&opt);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_PushButtonLayoutItem,&opt.super_QStyleOption);
  QStyleOptionButton::~QStyleOptionButton(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButtonPrivate::resetLayoutItemMargins()
{
    Q_Q(QPushButton);
    QStyleOptionButton opt;
    q->initStyleOption(&opt);
    setLayoutItemMargins(QStyle::SE_PushButtonLayoutItem, &opt);
}